

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_pack.c
# Opt level: O2

size_t pack_fail(char **buf,FailMsg *fmsg)

{
  size_t sVar1;
  size_t n;
  char *local_20;
  
  if (fmsg->msg == (char *)0x0) {
    n = 8;
  }
  else {
    sVar1 = strlen(fmsg->msg);
    n = sVar1 + 8;
  }
  local_20 = (char *)emalloc(n);
  *buf = local_20;
  local_20[0] = '\0';
  local_20[1] = '\0';
  local_20[2] = '\0';
  local_20[3] = '\x01';
  local_20 = local_20 + 4;
  pack_str(&local_20,fmsg->msg);
  return n;
}

Assistant:

static size_t pack_fail(char **buf, FailMsg * fmsg)
{
    char *ptr;
    size_t len;

    len = 4 + 4 + (fmsg->msg ? strlen(fmsg->msg) : 0);
    *buf = ptr = (char *)emalloc(len);

    pack_type(&ptr, CK_MSG_FAIL);
    pack_str(&ptr, fmsg->msg);

    return len;
}